

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ChildWindowComparer(void *lhs,void *rhs)

{
  long lVar1;
  long lVar2;
  int d_2;
  int d_1;
  int d;
  ImGuiWindow *b;
  ImGuiWindow *a;
  void *rhs_local;
  void *lhs_local;
  
  lVar1 = *lhs;
  lVar2 = *rhs;
  lhs_local._4_4_ = (*(uint *)(lVar1 + 0xc) & 0x2000000) - (*(uint *)(lVar2 + 0xc) & 0x2000000);
  if (((lhs_local._4_4_ == 0) &&
      (lhs_local._4_4_ = (*(uint *)(lVar1 + 0xc) & 0x1000000) - (*(uint *)(lVar2 + 0xc) & 0x1000000)
      , lhs_local._4_4_ == 0)) &&
     (lhs_local._4_4_ = (*(uint *)(lVar1 + 0xc) & 0x800000) - (*(uint *)(lVar2 + 0xc) & 0x800000),
     lhs_local._4_4_ == 0)) {
    lhs_local._4_4_ = *(int *)(lVar1 + 0x10) - *(int *)(lVar2 + 0x10);
  }
  return lhs_local._4_4_;
}

Assistant:

static int ChildWindowComparer(const void* lhs, const void* rhs)
{
    const ImGuiWindow* a = *(const ImGuiWindow**)lhs;
    const ImGuiWindow* b = *(const ImGuiWindow**)rhs;
    if (int d = (a->Flags & ImGuiWindowFlags_Popup) - (b->Flags & ImGuiWindowFlags_Popup))
        return d;
    if (int d = (a->Flags & ImGuiWindowFlags_Tooltip) - (b->Flags & ImGuiWindowFlags_Tooltip))
        return d;
    if (int d = (a->Flags & ImGuiWindowFlags_ComboBox) - (b->Flags & ImGuiWindowFlags_ComboBox))
        return d;
    return (a->IndexWithinParent - b->IndexWithinParent);
}